

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equalsi<char8_t,char16_t>
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char16_t *pcVar4;
  uint uVar5;
  char8_t *pcVar6;
  char8_t *pcVar7;
  char8_t *extraout_RDX;
  char8_t *pcVar8;
  wchar32 wVar9;
  char8_t *pcVar10;
  long lVar11;
  jessilib *this;
  decode_result dVar12;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  
  pcVar4 = rhs._M_str;
  pcVar6 = (char8_t *)rhs._M_len;
  pcVar10 = lhs._M_str;
  this = (jessilib *)lhs._M_len;
  pcVar8 = pcVar6;
  do {
    if ((this == (jessilib *)0x0) || (pcVar8 == (char8_t *)0x0)) {
      return this == (jessilib *)0x0 && pcVar8 == (char8_t *)0x0;
    }
    in_string._M_str = pcVar6;
    in_string._M_len = (size_t)pcVar10;
    dVar12 = decode_codepoint_utf8<char8_t>(this,in_string);
    pcVar7 = (char8_t *)dVar12.units;
    wVar9 = (wchar32)(ushort)*pcVar4;
    lVar11 = 1;
    pcVar6 = pcVar7;
    if ((pcVar8 != (char8_t *)0x1) && ((wVar9 & 0xfc00U) == 0xd800)) {
      uVar5 = (ushort)pcVar4[1] & 0xfc00;
      pcVar6 = (char8_t *)(ulong)uVar5;
      if (uVar5 == 0xdc00) {
        wVar9 = (uint)(ushort)*pcVar4 * 0x400 + (uint)(ushort)pcVar4[1] + L'\xfca02400';
        lVar11 = 2;
      }
    }
    if (pcVar7 == (char8_t *)0x0) {
LAB_00231beb:
      bVar1 = false;
    }
    else {
      if (dVar12.codepoint != wVar9) {
        iVar2 = jessilib::fold(dVar12.codepoint);
        iVar3 = jessilib::fold(wVar9);
        pcVar6 = extraout_RDX;
        if (iVar2 != iVar3) goto LAB_00231beb;
      }
      pcVar10 = pcVar10 + (long)pcVar7;
      this = this + -(long)pcVar7;
      pcVar4 = pcVar4 + lVar11;
      pcVar8 = pcVar8 + -lVar11;
      bVar1 = true;
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}